

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormals
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  ParameterSet *this_00;
  bool bVar1;
  string local_58;
  int local_38;
  allocator local_31;
  int denoise_index;
  
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_58,"Denoise Type",&local_31);
  bVar1 = ParameterSet::getValue(this_00,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    if (local_38 == 0) {
      updateFilteredNormalsLocalScheme(this,mesh,filtered_normals);
    }
    else {
      updateFilteredNormalsGlobalScheme(this,mesh,filtered_normals);
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int denoise_index;
    if(!parameter_set_->getValue(string("Denoise Type"), denoise_index))
        return;

    DenoiseType denoise_type = (denoise_index == 0) ? kLocal : kGlobal;

    if(denoise_type == kLocal)
        updateFilteredNormalsLocalScheme(mesh, filtered_normals);
    else if(denoise_type == kGlobal)
        updateFilteredNormalsGlobalScheme(mesh, filtered_normals);

}